

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedType<short>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedType<short> min,WrappedType<short> max,float gridSize)

{
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ushort uVar5;
  short sVar6;
  int iVar7;
  uint uVar8;
  short sVar9;
  int iVar10;
  short sVar11;
  int iVar12;
  ushort uVar13;
  short sVar14;
  short sVar15;
  ushort uVar16;
  short sVar17;
  uint uVar18;
  float fVar19;
  deRandom rnd;
  uint local_b0;
  int local_9c;
  int local_98;
  deRandom local_90;
  ulong local_80;
  int local_74;
  char *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  char *local_40;
  ulong local_38;
  
  uVar8 = componentCount * 2;
  if (stride != 0) {
    uVar8 = stride;
  }
  local_38 = (ulong)(uVar8 * 2);
  iVar7 = uVar8 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar7 = 0;
  }
  local_70 = (char *)operator_new__((long)(iVar7 * count + offset));
  deRandom_init(&local_90,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    iVar12 = (int)min.m_value;
    fVar19 = (float)(int)max.m_value - (float)iVar12;
    uVar18 = -(uint)(-fVar19 <= fVar19);
    uVar13 = (ushort)(int)((float)(~uVar18 & (uint)-fVar19 | (uint)fVar19 & uVar18) * gridSize);
    uVar5 = 0x400;
    if (0x400 < (short)uVar13) {
      uVar5 = uVar13;
    }
    if (0 < count) {
      iVar10 = (int)(short)uVar5;
      local_40 = local_70 + offset;
      uVar18 = max.m_value - iVar12;
      local_48 = (ulong)(uVar8 * 3);
      local_50 = (ulong)(uVar8 * 4);
      local_58 = (ulong)(uVar8 * 5);
      local_98 = 4;
      local_9c = 6;
      local_80 = 0;
      local_68 = (ulong)uVar8;
      local_60 = (ulong)(uint)count;
      do {
        local_b0 = 0;
        while( true ) {
          uVar8 = (uint)(ushort)min.m_value;
          iVar2 = iVar12;
          if (min.m_value < max.m_value) {
            dVar1 = deRandom_getUint32(&local_90);
            uVar8 = dVar1 % uVar18 + (uint)(ushort)min.m_value;
            iVar2 = (int)(short)uVar8;
          }
          local_74 = uVar8 - iVar2 % iVar10;
          uVar8 = (uint)(ushort)max.m_value - local_74 & 0x7fff;
          uVar13 = uVar5;
          if (uVar5 < (ushort)uVar8) {
            dVar1 = deRandom_getUint32(&local_90);
            uVar13 = (short)(dVar1 % (uVar8 - iVar10)) + uVar5;
          }
          uVar8 = (uint)(ushort)min.m_value;
          iVar2 = iVar12;
          if (min.m_value < max.m_value) {
            dVar1 = deRandom_getUint32(&local_90);
            uVar8 = dVar1 % uVar18 + (uint)(ushort)min.m_value;
            iVar2 = (int)(short)uVar8;
          }
          iVar2 = uVar8 - iVar2 % iVar10;
          uVar8 = (uint)(ushort)max.m_value - iVar2 & 0x7fff;
          uVar16 = uVar5;
          if (uVar5 < (ushort)uVar8) {
            dVar1 = deRandom_getUint32(&local_90);
            uVar16 = (short)(dVar1 % (uVar8 - iVar10)) + uVar5;
          }
          sVar14 = uVar13 - (short)uVar13 % (short)uVar5;
          sVar17 = uVar16 - (short)uVar16 % (short)uVar5;
          if (componentCount < 3) break;
          if (min.m_value < max.m_value) {
            dVar1 = deRandom_getUint32(&local_90);
            sVar9 = (short)(dVar1 % uVar18) + min.m_value;
            sVar9 = sVar9 - sVar9 % (short)uVar5;
            sVar6 = 1;
            if (componentCount != 3) {
              dVar1 = deRandom_getUint32(&local_90);
              sVar6 = (short)(dVar1 % uVar18) + min.m_value;
              sVar6 = sVar6 - sVar6 % (short)uVar5;
            }
          }
          else {
            sVar9 = min.m_value - min.m_value % (short)uVar5;
            sVar6 = sVar9;
            if (componentCount == 3) {
              sVar6 = 1;
            }
          }
          fVar19 = (float)(int)sVar9 + (float)(int)sVar14;
          uVar8 = -(uint)(-fVar19 <= fVar19);
          if ((((float)iVar10 <= (float)(~uVar8 & (uint)-fVar19 | (uint)fVar19 & uVar8)) &&
              (fVar19 = (float)(int)sVar6 + (float)(int)sVar17, uVar8 = -(uint)(-fVar19 <= fVar19),
              (float)iVar10 <= (float)(~uVar8 & (uint)-fVar19 | (uint)fVar19 & uVar8))) ||
             (2 < local_b0)) goto LAB_01856a26;
          local_b0 = local_b0 + 1;
        }
        sVar9 = 0;
        sVar6 = 1;
LAB_01856a26:
        iVar3 = iVar7 * (int)local_80;
        sVar11 = (short)local_74;
        *(short *)(local_40 + iVar3) = sVar11;
        sVar15 = (short)iVar2;
        *(short *)(local_40 + (iVar3 + 2)) = sVar15;
        iVar2 = (int)local_68;
        sVar14 = sVar14 + sVar11;
        *(short *)(local_40 + (iVar3 + iVar2)) = sVar14;
        *(short *)(local_40 + (iVar3 + iVar2 + 2)) = sVar15;
        sVar17 = sVar17 + sVar15;
        *(short *)(local_40 + (iVar3 + (int)local_38)) = sVar11;
        *(short *)(local_40 + (iVar3 + (int)local_38 + 2)) = sVar17;
        *(short *)(local_40 + (iVar3 + (int)local_48)) = sVar11;
        *(short *)(local_40 + (iVar3 + 2 + (int)local_48)) = sVar17;
        *(short *)(local_40 + (iVar3 + (int)local_50)) = sVar14;
        *(short *)(local_40 + (iVar3 + 2 + (int)local_50)) = sVar15;
        *(short *)(local_40 + (iVar3 + (int)local_58)) = sVar14;
        *(short *)(local_40 + (iVar3 + (int)local_58 + 2)) = sVar17;
        if (2 < componentCount) {
          lVar4 = 6;
          iVar3 = local_98;
          do {
            *(short *)(local_40 + iVar3) = sVar9;
            iVar3 = iVar3 + iVar2;
            lVar4 = lVar4 + -1;
          } while (lVar4 != 0);
          if (componentCount != 3) {
            lVar4 = 6;
            iVar3 = local_9c;
            do {
              *(short *)(local_40 + iVar3) = sVar6;
              iVar3 = iVar3 + iVar2;
              lVar4 = lVar4 + -1;
            } while (lVar4 != 0);
          }
        }
        local_80 = local_80 + 1;
        local_98 = local_98 + iVar7;
        local_9c = local_9c + iVar7;
      } while (local_80 != local_60);
    }
  }
  return local_70;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}